

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

void __thiscall QOpenGLTexture::setSize(QOpenGLTexture *this,int width,int height,int depth)

{
  Target TVar1;
  QOpenGLTexturePrivate *this_00;
  bool bVar2;
  uint uVar3;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  QOpenGLTexturePrivate::create(this_00);
  if (((this->d_ptr).d)->storageAllocated == true) {
    local_50[0] = '\x02';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[0x14] = '\0';
    local_50[0x15] = '\0';
    local_50[0x16] = '\0';
    local_50[0x17] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    local_50[8] = '\0';
    local_50[9] = '\0';
    local_50[10] = '\0';
    local_50[0xb] = '\0';
    local_50[0xc] = '\0';
    local_50[0xd] = '\0';
    local_50[0xe] = '\0';
    local_50[0xf] = '\0';
    local_50[0x10] = '\0';
    local_50[0x11] = '\0';
    local_50[0x12] = '\0';
    local_50[0x13] = '\0';
    local_38 = "default";
    QMessageLogger::warning
              (local_50,
               "Cannot resize a texture that already has storage allocated.\nTo do so, destroy() the texture and then create() and setSize()"
              );
    goto LAB_00152fde;
  }
  if (((((width & width - 1U) != 0) ||
       (uVar3 = height - ((uint)height >> 1 & 0x55555555),
       uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
       1 < ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18)) ||
      (uVar3 = depth - ((uint)depth >> 1 & 0x55555555),
      uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
      1 < ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18)) &&
     ((bVar2 = hasFeature(NPOTTextureRepeat), !bVar2 && (this_00->target != TargetRectangle)))) {
    QOpenGLTexturePrivate::setWrapMode(this_00,ClampToEdge);
  }
  TVar1 = this_00->target;
  if (TVar1 == Target1D) goto LAB_00152fda;
  if (TVar1 != Target2D) {
    if (TVar1 == Target3D) {
      this_00->dimensions[0] = width;
      this_00->dimensions[1] = height;
      this_00->dimensions[2] = depth;
      goto LAB_00152fde;
    }
    if (TVar1 != TargetRectangle) {
      if (TVar1 == TargetCubeMap) {
LAB_00152fd2:
        if (width != height) {
          local_50[0] = '\x02';
          local_50[1] = '\0';
          local_50[2] = '\0';
          local_50[3] = '\0';
          local_50[0x14] = '\0';
          local_50[0x15] = '\0';
          local_50[0x16] = '\0';
          local_50[0x17] = '\0';
          local_50[4] = '\0';
          local_50[5] = '\0';
          local_50[6] = '\0';
          local_50[7] = '\0';
          local_50[8] = '\0';
          local_50[9] = '\0';
          local_50[10] = '\0';
          local_50[0xb] = '\0';
          local_50[0xc] = '\0';
          local_50[0xd] = '\0';
          local_50[0xe] = '\0';
          local_50[0xf] = '\0';
          local_50[0x10] = '\0';
          local_50[0x11] = '\0';
          local_50[0x12] = '\0';
          local_50[0x13] = '\0';
          local_38 = "default";
          QMessageLogger::warning
                    (local_50,"QAbstractOpenGLTexture::setSize(): Cube map textures must be square")
          ;
        }
        this_00->dimensions[1] = width;
      }
      else if (TVar1 != Target1DArray) {
        if ((TVar1 != Target2DArray) && (TVar1 != Target2DMultisampleArray)) {
          if (TVar1 == TargetCubeMapArray) goto LAB_00152fd2;
          if (TVar1 != Target2DMultisample) {
            if (TVar1 != TargetBuffer) goto LAB_00152fde;
            goto LAB_00152fda;
          }
        }
        goto LAB_00152fc8;
      }
LAB_00152fda:
      this_00->dimensions[0] = width;
      goto LAB_00152fde;
    }
  }
LAB_00152fc8:
  this_00->dimensions[0] = width;
  this_00->dimensions[1] = height;
LAB_00152fde:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLTexture::setSize(int width, int height, int depth)
{
    Q_D(QOpenGLTexture);
    d->create();
    if (isStorageAllocated()) {
        qWarning("Cannot resize a texture that already has storage allocated.\n"
                 "To do so, destroy() the texture and then create() and setSize()");
        return;
    }

    if (isNpot(width, height, depth) && !hasFeature(Feature::NPOTTextureRepeat) && d->target != Target::TargetRectangle)
        d->setWrapMode(WrapMode::ClampToEdge);

    switch (d->target) {
    case QOpenGLTexture::Target1D:
    case QOpenGLTexture::Target1DArray:
    case QOpenGLTexture::TargetBuffer:
        d->dimensions[0] = width;
        Q_UNUSED(height);
        Q_UNUSED(depth);
        break;

    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::Target2DArray:
    case QOpenGLTexture::TargetRectangle:
    case QOpenGLTexture::Target2DMultisample:
    case QOpenGLTexture::Target2DMultisampleArray:
        d->dimensions[0] = width;
        d->dimensions[1] = height;
        Q_UNUSED(depth);
        break;

    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetCubeMapArray:
        if (width != height)
            qWarning("QAbstractOpenGLTexture::setSize(): Cube map textures must be square");
        d->dimensions[0] = d->dimensions[1] = width;
        Q_UNUSED(depth);
        break;

    case QOpenGLTexture::Target3D:
        d->dimensions[0] = width;
        d->dimensions[1] = height;
        d->dimensions[2] = depth;
        break;
    }
}